

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

utf_error utf8::internal::validate_next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         end,uint32_t *code_point)

{
  bool bVar1;
  difference_type length_00;
  utf_error local_4c;
  utf_error err;
  octet_difference_type length;
  char *pcStack_30;
  uint32_t cp;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  original_it;
  uint32_t *code_point_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  
  pcStack_30 = it->_M_current;
  length._4_4_ = 0;
  original_it._M_current = (char *)code_point;
  length_00 = sequence_length<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )it->_M_current);
  local_4c = UTF8_OK;
  switch(length_00) {
  case 0:
    return INVALID_LEAD;
  case 1:
    local_4c = get_sequence_1<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (it,end,(uint32_t *)((long)&length + 4));
    break;
  case 2:
    local_4c = get_sequence_2<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (it,end,(uint32_t *)((long)&length + 4));
    break;
  case 3:
    local_4c = get_sequence_3<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (it,end,(uint32_t *)((long)&length + 4));
    break;
  case 4:
    local_4c = get_sequence_4<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (it,end,(uint32_t *)((long)&length + 4));
  }
  if (local_4c == UTF8_OK) {
    bVar1 = is_code_point_valid<unsigned_int>(length._4_4_);
    if (bVar1) {
      bVar1 = is_overlong_sequence<long>(length._4_4_,length_00);
      if (!bVar1) {
        *(uint *)original_it._M_current = length._4_4_;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(it);
        return UTF8_OK;
      }
      local_4c = OVERLONG_SEQUENCE;
    }
    else {
      local_4c = INVALID_CODE_POINT;
    }
  }
  it->_M_current = pcStack_30;
  return local_4c;
}

Assistant:

utf_error validate_next(octet_iterator& it, octet_iterator end, uint32_t& code_point)
    {
        // Save the original value of it so we can go back in case of failure
        // Of course, it does not make much sense with i.e. stream iterators
        octet_iterator original_it = it;

        uint32_t cp = 0;
        // Determine the sequence length based on the lead octet
        typedef typename std::iterator_traits<octet_iterator>::difference_type octet_difference_type;
        const octet_difference_type length = utf8::internal::sequence_length(it);

        // Get trail octets and calculate the code point
        utf_error err = UTF8_OK;
        switch (length) {
            case 0: 
                return INVALID_LEAD;
            case 1:
                err = utf8::internal::get_sequence_1(it, end, cp);
                break;
            case 2:
                err = utf8::internal::get_sequence_2(it, end, cp);
            break;
            case 3:
                err = utf8::internal::get_sequence_3(it, end, cp);
            break;
            case 4:
                err = utf8::internal::get_sequence_4(it, end, cp);
            break;
        }

        if (err == UTF8_OK) {
            // Decoding succeeded. Now, security checks...
            if (utf8::internal::is_code_point_valid(cp)) {
                if (!utf8::internal::is_overlong_sequence(cp, length)){
                    // Passed! Return here.
                    code_point = cp;
                    ++it;
                    return UTF8_OK;
                }
                else
                    err = OVERLONG_SEQUENCE;
            }
            else 
                err = INVALID_CODE_POINT;
        }

        // Failure branch - restore the original value of the iterator
        it = original_it;
        return err;
    }